

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferTestUtil.cpp
# Opt level: O2

char * deqp::gles2::Functional::BufferTestUtil::getBufferTargetName(deUint32 target)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar2 = (char *)0x0;
  if (target == 0x8893) {
    pcVar2 = "element_array";
  }
  pcVar1 = "array";
  if (target != 0x8892) {
    pcVar1 = pcVar2;
  }
  return pcVar1;
}

Assistant:

const char* getBufferTargetName (deUint32 target)
{
	switch (target)
	{
		case GL_ARRAY_BUFFER:				return "array";
		case GL_ELEMENT_ARRAY_BUFFER:		return "element_array";
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}